

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O3

void __thiscall
wasm_tabletype_t::wasm_tabletype_t
          (wasm_tabletype_t *this,wasm_valtype_t *type,wasm_limits_t *limits)

{
  Enum EVar1;
  ExternType EVar2;
  ExternType *pEVar3;
  
  pEVar3 = (ExternType *)operator_new(0x28);
  EVar1 = (type->I).enum_;
  EVar2.kind = (*limits).max;
  EVar2._vptr_ExternType = (_func_int **)((ulong)*limits & 0xffffffff);
  EVar2._12_4_ = 0;
  pEVar3[1] = EVar2;
  pEVar3->kind = Table;
  pEVar3->_vptr_ExternType = (_func_int **)&PTR__ExternType_001e48e0;
  *(Enum *)&pEVar3->field_0xc = EVar1;
  *(undefined2 *)&pEVar3[2]._vptr_ExternType = 1;
  (this->super_wasm_externtype_t).I._M_t.
  super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>.
  _M_t.
  super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
  .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl = pEVar3;
  (this->super_wasm_externtype_t)._vptr_wasm_externtype_t =
       (_func_int **)&PTR__wasm_externtype_t_001e4c88;
  (this->elemtype).I.enum_ = EVar1;
  this->limits = *limits;
  fprintf(_stderr,"CAPI: [%s] \n","wasm_valtype_delete");
  operator_delete(type);
  return;
}

Assistant:

wasm_tabletype_t(own wasm_valtype_t* type, const wasm_limits_t* limits)
      : wasm_externtype_t{MakeUnique<TableType>(type->I,
                                                ToWabtLimits(*limits))},
        elemtype(*type),
        limits(*limits) {
    wasm_valtype_delete(type);
  }